

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Glucose::SimpSolver::extendModel(SimpSolver *this)

{
  int iVar1;
  uint *puVar2;
  lbool *plVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  
  if ((this->super_Solver).model.sz == 0) {
    vec<Glucose::lbool>::growTo(&(this->super_Solver).model,(this->super_Solver).vardata.sz);
  }
  iVar1 = (this->elimclauses).sz;
  if (1 < iVar1) {
    uVar5 = iVar1 - 1;
    do {
      puVar2 = (this->elimclauses).data;
      uVar7 = puVar2[uVar5];
      uVar6 = uVar5 - 1;
      plVar3 = (this->super_Solver).model.data;
      if (1 < (int)uVar7) {
        puVar8 = puVar2 + uVar6;
        do {
          if (((byte)*puVar8 & 1 ^ plVar3[(int)*puVar8 >> 1].value) != 1) goto LAB_0011275d;
          uVar6 = uVar6 - 1;
          puVar8 = puVar8 + -1;
          bVar4 = 2 < (int)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar4);
        uVar7 = 1;
      }
      plVar3[(int)puVar2[(int)uVar6] >> 1].value = (byte)puVar2[(int)uVar6] & 1;
LAB_0011275d:
      uVar5 = uVar6 - uVar7;
    } while (uVar5 != 0 && (int)uVar7 <= (int)uVar6);
  }
  return;
}

Assistant:

void SimpSolver::extendModel()
{
    int i, j;
    Lit x;

    if(model.size()==0) model.growTo(nVars());

    for (i = elimclauses.size()-1; i > 0; i -= j){
        for (j = elimclauses[i--]; j > 1; j--, i--)
            if (modelValue(toLit(elimclauses[i])) != l_False)
                goto next;

        x = toLit(elimclauses[i]);
        model[var(x)] = lbool(!sign(x));
    next:;
    }
}